

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O1

void Glucose_ReadDimacs(char *pFileName,SimpSolver *s)

{
  byte *pbVar1;
  byte bVar2;
  vec<Gluco::Lit> *ps;
  int iVar3;
  byte *pbVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  Lit local_4c;
  vec<Gluco::Lit> *local_48;
  byte *local_40;
  vec<Gluco::Lit> *local_38;
  
  pbVar4 = (byte *)Extra_FileReadContents(pFileName);
  if ((s->super_Solver).user_lits.data != (Lit *)0x0) {
    (s->super_Solver).user_lits.sz = 0;
  }
  local_48 = &(s->super_Solver).user_lits;
  local_38 = &(s->super_Solver).add_tmp;
  iVar6 = 0;
  local_40 = pbVar4;
  do {
    bVar2 = *pbVar4;
    if ((bVar2 == 99) || (bVar2 == 0x70)) {
      pbVar4 = pbVar4 + -1;
      do {
        pbVar1 = pbVar4 + 1;
        pbVar4 = pbVar4 + 1;
      } while (*pbVar1 != 10);
    }
    else {
      if (bVar2 == 0) {
        if (local_40 != (byte *)0x0) {
          free(local_40);
        }
        return;
      }
      for (; uVar5 = (ulong)*pbVar4, uVar5 < 0x2e; pbVar4 = pbVar4 + 1) {
        if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
          if (uVar5 == 0x2d) {
            pbVar4 = pbVar4 + 1;
            iVar7 = 1;
            goto LAB_005b7ac9;
          }
          break;
        }
      }
      iVar7 = 0;
LAB_005b7ac9:
      bVar2 = *pbVar4;
      iVar3 = atoi((char *)(pbVar4 + (bVar2 == 0x2b)));
      if (iVar3 == 0) {
        if (0 < (s->super_Solver).user_lits.sz) {
          while (ps = local_38, (s->super_Solver).vardata.sz <= iVar6) {
            Gluco::SimpSolver::newVar(s,true,true);
          }
          Gluco::vec<Gluco::Lit>::copyTo(local_48,local_38);
          Gluco::SimpSolver::addClause_(s,ps);
          if ((s->super_Solver).user_lits.data != (Lit *)0x0) {
            (s->super_Solver).user_lits.sz = 0;
          }
        }
      }
      else {
        if (iVar3 < 1) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        if (iVar6 <= iVar3 + -1) {
          iVar6 = iVar3 + -1;
        }
        local_4c.x = iVar7 + iVar3 * 2 + -2;
        Gluco::vec<Gluco::Lit>::push(local_48,&local_4c);
      }
      pbVar4 = pbVar4 + ((ulong)(bVar2 == 0x2b) - 1);
      do {
        pbVar1 = pbVar4 + 1;
        pbVar4 = pbVar4 + 1;
      } while ((byte)(*pbVar1 - 0x30) < 10);
    }
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

void Glucose_ReadDimacs( char * pFileName, SimpSolver& s )
{
    vec<Lit> * lits = &s.user_lits;
    char * pBuffer = Extra_FileReadContents( pFileName );
    char * pTemp; int fComp, Var, VarMax = 0;
    lits->clear();
    for ( pTemp = pBuffer; *pTemp; pTemp++ )
    {
        if ( *pTemp == 'c' || *pTemp == 'p' ) {
            while ( *pTemp != '\n' )
                pTemp++;
            continue;
        }
        while ( *pTemp == ' ' || *pTemp == '\t' || *pTemp == '\r' || *pTemp == '\n' )
            pTemp++;
        fComp = 0;
        if ( *pTemp == '-' )
            fComp = 1, pTemp++;
        if ( *pTemp == '+' )
            pTemp++;
        Var = atoi( pTemp );
        if ( Var == 0 ) {
            if ( lits->size() > 0 ) {
                s.addVar( VarMax );
                s.addClause(*lits);
                lits->clear();
            }
        }
        else {
            Var--;
            VarMax = Abc_MaxInt( VarMax, Var );
            lits->push( toLit(Abc_Var2Lit(Var, fComp)) );
        }
        while ( *pTemp >= '0' && *pTemp <= '9' )
            pTemp++;
    }
    ABC_FREE( pBuffer );
}